

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O0

int __thiscall helics::zeromq::ZmqComms::processIncomingMessage(ZmqComms *this,message_t *msg)

{
  bool bVar1;
  size_t sVar2;
  CommsInterface *this_00;
  ActionMessage Q;
  ActionMessage M;
  string str;
  ActionMessage *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  allocator<char> *in_stack_fffffffffffffdf8;
  size_type in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  void *in_stack_fffffffffffffe18;
  ActionMessage *in_stack_fffffffffffffe20;
  CommsInterface *in_stack_fffffffffffffe60;
  string_view in_stack_fffffffffffffe68;
  int local_104;
  int local_4;
  
  sVar2 = zmq::message_t::size
                    ((message_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  if (sVar2 == 5) {
    in_stack_fffffffffffffe10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         zmq::message_t::data
                   ((message_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    in_stack_fffffffffffffe18 =
         (void *)zmq::message_t::size
                           ((message_t *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    in_stack_fffffffffffffe20 = (ActionMessage *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffffe10,
               (char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (char *)in_stack_fffffffffffffde8);
    if (bVar1) {
      local_4 = -1;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    if (bVar1) {
      return local_4;
    }
  }
  this_00 = (CommsInterface *)
            zmq::message_t::data
                      ((message_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  zmq::message_t::size((message_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
  bVar1 = isValidCommand((ActionMessage *)0x4d1081);
  if (bVar1) {
    bVar1 = isProtocolCommand((ActionMessage *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    if (bVar1) {
      if (local_104 == 1999) {
        CommsInterface::setRxStatus
                  (this_00,(ConnectionStatus)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
        in_stack_fffffffffffffdf4 = local_104;
      }
      else {
        in_stack_fffffffffffffdf4 = local_104;
        if (local_104 == 0x16570bf) {
          local_4 = -1;
          goto LAB_004d11c8;
        }
      }
    }
    std::function<void_(helics::ActionMessage_&&)>::operator()
              ((function<void_(helics::ActionMessage_&&)> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8);
    local_4 = 0;
    local_104 = in_stack_fffffffffffffdf4;
  }
  else {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_fffffffffffffdf8);
    CommsInterface::logError(in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    zmq::message_t::data((message_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
    ;
    zmq::message_t::size((message_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
    ;
    ActionMessage::ActionMessage
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10
              );
    local_4 = 0;
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_104 = in_stack_fffffffffffffdf4;
  }
LAB_004d11c8:
  ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(local_104,in_stack_fffffffffffffdf0));
  return local_4;
}

Assistant:

int ZmqComms::processIncomingMessage(zmq::message_t& msg)
{
    if (msg.size() == 5) {
        std::string str(static_cast<char*>(msg.data()), msg.size());
        if (str == "close") {
            return (-1);
        }
    }
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());
    if (!isValidCommand(M)) {
        logError("invalid command received");
        ActionMessage Q(static_cast<std::byte*>(msg.data()), msg.size());
        return 0;
    }
    if (isProtocolCommand(M)) {
        switch (M.messageID) {
            case CLOSE_RECEIVER:
                return (-1);
            case RECONNECT_RECEIVER:
                setRxStatus(ConnectionStatus::CONNECTED);
                break;
            default:
                break;
        }
    }
    ActionCallback(std::move(M));
    return 0;
}